

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,bool clean,bool verbose)

{
  cmState *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  cmGlobalGenerator *gg;
  ostream *poVar5;
  allocator<char> local_8aa;
  allocator<char> local_8a9;
  string projName;
  string local_888;
  string *local_868;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_860;
  string local_858;
  string cachePath;
  string output;
  
  local_860 = nativeOptions;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"",(allocator<char> *)&cachePath);
  SetHomeDirectory(this,&output);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"",(allocator<char> *)&cachePath);
  SetHomeOutputDirectory(this,&output);
  std::__cxx11::string::~string((string *)&output);
  bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar5 = std::operator<<(poVar5,(string *)dir);
    std::operator<<(poVar5," is not a directory\n");
    return 1;
  }
  local_868 = config;
  FindCacheFile(&cachePath,dir);
  bVar2 = LoadCache(this,&cachePath);
  if (bVar2) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"CMAKE_GENERATOR",(allocator<char> *)&projName);
    pcVar4 = cmState::GetCacheEntryValue(pcVar1,&output);
    std::__cxx11::string::~string((string *)&output);
    if (pcVar4 == (char *)0x0) {
      std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,pcVar4,(allocator<char> *)&projName);
      gg = CreateGlobalGenerator(this,&output);
      std::__cxx11::string::~string((string *)&output);
      if (gg != (cmGlobalGenerator *)0x0) {
        SetGlobalGenerator(this,gg);
        pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&output,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)&projName);
        pcVar4 = cmState::GetCacheEntryValue(pcVar1,&output);
        std::__cxx11::string::~string((string *)&output);
        if (pcVar4 != (char *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile((cmMakefile *)&output,gg,(cmStateSnapshot *)&projName);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&projName,pcVar4,(allocator<char> *)&local_888);
          iVar3 = (*gg->_vptr_cmGlobalGenerator[8])(gg,&projName,&output);
          std::__cxx11::string::~string((string *)&projName);
          cmMakefile::~cmMakefile((cmMakefile *)&output);
          if ((char)iVar3 == '\0') goto LAB_001b837c;
        }
        pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&output,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)&projName);
        pcVar4 = cmState::GetCacheEntryValue(pcVar1,&output);
        std::__cxx11::string::~string((string *)&output);
        if (pcVar4 != (char *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile((cmMakefile *)&output,gg,(cmStateSnapshot *)&projName);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&projName,pcVar4,(allocator<char> *)&local_888);
          iVar3 = (*gg->_vptr_cmGlobalGenerator[9])(gg,&projName,&output);
          std::__cxx11::string::~string((string *)&projName);
          cmMakefile::~cmMakefile((cmMakefile *)&output);
          if ((char)iVar3 == '\0') goto LAB_001b837c;
        }
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        projName._M_dataplus._M_p = (pointer)&projName.field_2;
        projName._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        projName.field_2._M_allocated_capacity =
             projName.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_888,"CMAKE_PROJECT_NAME",(allocator<char> *)&local_858);
        pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_888);
        std::__cxx11::string::~string((string *)&local_888);
        if (pcVar4 == (char *)0x0) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
          iVar3 = 1;
        }
        else {
          std::__cxx11::string::assign((char *)&projName);
          pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_888,"CMAKE_VERBOSE_MAKEFILE",(allocator<char> *)&local_858);
          pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_888);
          std::__cxx11::string::~string((string *)&local_888);
          bVar2 = cmSystemTools::IsOn(pcVar4);
          (*gg->_vptr_cmGlobalGenerator[0x12])(gg,&std::cerr,jobs);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"",&local_8a9);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"",&local_8aa);
          iVar3 = cmGlobalGenerator::Build
                            (gg,jobs,&local_888,dir,&projName,targets,&output,&local_858,local_868,
                             clean,false,bVar2 || verbose,(cmDuration)0x0,OUTPUT_PASSTHROUGH,
                             local_860);
          std::__cxx11::string::~string((string *)&local_858);
          std::__cxx11::string::~string((string *)&local_888);
        }
        std::__cxx11::string::~string((string *)&projName);
        std::__cxx11::string::~string((string *)&output);
        goto LAB_001b837f;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"");
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::operator<<(poVar5,"\"\n");
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
  }
LAB_001b837c:
  iVar3 = 1;
LAB_001b837f:
  std::__cxx11::string::~string((string *)&cachePath);
  return iVar3;
}

Assistant:

int cmake::Build(int jobs, const std::string& dir,
                 const std::vector<std::string>& targets,
                 const std::string& config,
                 const std::vector<std::string>& nativeOptions, bool clean,
                 bool verbose)
{

  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  const char* cachedGenerator =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  cmGlobalGenerator* gen = this->CreateGlobalGenerator(cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could create CMAKE_GENERATOR \"" << cachedGenerator
              << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(gen);
  const char* cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(gen, this->GetCurrentSnapshot());
    if (!gen->SetGeneratorInstance(cachedGeneratorInstance, &mf)) {
      return 1;
    }
  }
  const char* cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(gen, this->GetCurrentSnapshot());
    if (!gen->SetGeneratorPlatform(cachedGeneratorPlatform, &mf)) {
      return 1;
    }
  }
  std::string output;
  std::string projName;
  const char* cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = cachedProjectName;

  const char* cachedVerbose =
    this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE");
  if (cmSystemTools::IsOn(cachedVerbose)) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath);

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = "Build files have been written to: ";
      message += this->GetHomeOutputDirectory();
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  gen->PrintBuildCommandAdvice(std::cerr, jobs);
  return gen->Build(jobs, "", dir, projName, targets, output, "", config,
                    clean, false, verbose, cmDuration::zero(),
                    cmSystemTools::OUTPUT_PASSTHROUGH, nativeOptions);
}